

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

PackedSlice * __thiscall kratos::PackedSlice::slice_member(PackedSlice *this,string *member_name)

{
  uint uVar1;
  int iVar2;
  VarType VVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined1 local_88 [8];
  shared_ptr<kratos::PackedSlice> p;
  undefined1 local_68 [8];
  shared_ptr<kratos::VarPackedStruct> v_1;
  __shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_38 [8];
  shared_ptr<kratos::PortPackedStruct> v;
  Var *root;
  PackedStruct *struct_;
  string *member_name_local;
  PackedSlice *this_local;
  
  if (this->original_struct_ == (PackedStruct *)0x0) {
    uVar1 = (*(this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x17])();
    if ((uVar1 & 1) == 0) {
      iVar2 = (*(this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x29])();
      v.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar2);
      VVar3 = Var::type((Var *)v.
                               super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
      if (VVar3 == PortIO) {
        Var::as<kratos::PortPackedStruct>((Var *)local_38);
        peVar4 = std::
                 __shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        (*(peVar4->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2e])(&local_48);
        root = (Var *)std::__shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>::get
                                (&local_48);
        std::shared_ptr<kratos::PackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::PackedStruct> *)&local_48);
        std::shared_ptr<kratos::PortPackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::PortPackedStruct> *)local_38);
      }
      else {
        Var::as<kratos::VarPackedStruct>((Var *)local_68);
        peVar5 = std::
                 __shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68);
        (*(peVar5->super_Var).super_IRNode._vptr_IRNode[0x2d])
                  (&p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        root = (Var *)std::__shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2> *)
                                 &p.
                                  super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        std::shared_ptr<kratos::PackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::PackedStruct> *)
                   &p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<kratos::VarPackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::VarPackedStruct> *)local_68);
      }
    }
    else {
      root = (Var *)this->def_->struct_;
    }
  }
  else {
    root = (Var *)this->original_struct_;
  }
  std::make_shared<kratos::PackedSlice,kratos::PackedSlice*>((PackedSlice **)local_88);
  peVar6 = std::__shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  set_up(peVar6,(PackedStruct *)root,member_name);
  std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
  emplace_back<std::shared_ptr<kratos::PackedSlice>&>
            ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
              *)&(this->super_VarSlice).super_Var.slices_,
             (shared_ptr<kratos::PackedSlice> *)local_88);
  peVar6 = std::__shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_88);
  std::shared_ptr<kratos::PackedSlice>::~shared_ptr((shared_ptr<kratos::PackedSlice> *)local_88);
  return peVar6;
}

Assistant:

PackedSlice &PackedSlice::slice_member(const std::string &member_name) {
    const PackedStruct *struct_;
    if (original_struct_) {
        struct_ = original_struct_;
    } else if (is_struct()) {
        struct_ = def_->struct_;
    } else {
        auto *root = get_var_root_parent();
        if (root->type() == VarType::PortIO) {
            auto v = root->as<PortPackedStruct>();
            struct_ = v->packed_struct().get();
        } else {
            auto v = root->as<VarPackedStruct>();
            struct_ = v->packed_struct().get();
        }
    }
    std::shared_ptr<PackedSlice> p = ::make_shared<PackedSlice>(this);
    p->set_up(*struct_, member_name);
    slices_.emplace_back(p);
    return *p;
}